

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O2

void nh_timeout(void)

{
  monst *pmVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  obj *poVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint in_EDI;
  char *pcVar13;
  char *line;
  bool bVar14;
  char local_138 [264];
  
  uVar10 = -(uint)(flags.moonphase != 4);
  if (flags.friday13 == '\0') {
    uVar10 = (uint)(flags.moonphase == 4);
  }
  if (uVar10 != (int)u.uluck) {
    uVar6 = 600;
    if (u.ugangr != 0) {
      uVar6 = 300;
    }
    if ((u.uhave._0_1_ & 1) != 0) {
      uVar6 = 300;
    }
    if (moves % uVar6 == 0) {
      bVar14 = false;
      iVar4 = stone_luck('\0');
      in_EDI = 0x20f;
      poVar7 = carrying(0x20f);
      if (poVar7 == (obj *)0x0) {
        in_EDI = 1;
        iVar5 = stone_luck('\x01');
        bVar14 = iVar5 == 0;
      }
      cVar2 = -1;
      if (((bool)((int)uVar10 < (int)u.uluck & (iVar4 < 0 | bVar14))) ||
         (cVar2 = '\x01', (bool)((bVar14 | 0 < iVar4) & (int)u.uluck < (int)uVar10))) {
        u.uluck = u.uluck + cVar2;
      }
    }
  }
  if (u.uprops[0x3e].intrinsic == 1) {
    pcVar13 = "Your body is solid again.";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) {
        pcVar13 = "You feel totally separated from the spirit world.";
      }
      else {
        cVar2 = dmgtype(youmonst.data,0x24);
        pcVar8 = "You feel totally separated from the spirit world.";
        pcVar13 = "Your body is solid again.";
LAB_0024a78e:
        if (cVar2 == '\0') {
          pcVar13 = pcVar8;
        }
      }
    }
LAB_0024a792:
    pline(pcVar13);
    in_EDI = (uint)pcVar13;
    stop_occupation();
  }
  else if (u.uprops[0x3e].intrinsic == 0xf) {
    pcVar13 = "Your body is beginning to feel more solid.";
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum != u.umonster) {
        cVar2 = dmgtype(youmonst.data,0x24);
        pcVar8 = "You feel more distant from the spirit world.";
        pcVar13 = "Your body is beginning to feel more solid.";
        goto LAB_0024a78e;
      }
      pcVar13 = "You feel more distant from the spirit world.";
    }
    goto LAB_0024a792;
  }
  if ((u._1052_1_ & 0x10) != 0) {
    return;
  }
  if (u.uprops[0x21].intrinsic != 0) {
    uVar10 = u.uprops[0x21].intrinsic & 0xffffff;
    if (uVar10 - 1 < 5) {
      pline(stoned_texts_rel + *(int *)(stoned_texts_rel + (5 - uVar10) * 4));
      nomul(0,(char *)0x0);
    }
    if (uVar10 == 3) {
      nomul(-3,"getting stoned");
    }
    else if (uVar10 == 5) {
      u.uprops[0x1a].intrinsic = 0;
    }
    in_EDI = 3;
    exercise(3,'\0');
  }
  if (u.uprops[0x3a].intrinsic != 0) {
    uVar10 = (u.uprops[0x3a].intrinsic & 0xffffff) >> 1;
    if ((u.uprops[0x3a].intrinsic & 0xffffff) < 10 && (u.uprops[0x3a].intrinsic & 1) != 0) {
      pcVar13 = slime_texts[4 - (ulong)uVar10];
      pcVar8 = strchr(pcVar13,0x25);
      if (pcVar8 == (char *)0x0) {
        pline(pcVar13);
        goto LAB_0024a911;
      }
      if (uVar10 != 4) {
        pcVar8 = "green slime";
        if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
           ((u.umonnum == u.umonster || (bVar3 = dmgtype(youmonst.data,0x24), bVar3 == '\0')))) {
          pcVar8 = rndmonnam();
        }
        an(pcVar8);
        pline(pcVar13);
        goto LAB_0024a911;
      }
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0024a897;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0024a88e;
LAB_0024a960:
        hcolor("green");
        pline(pcVar13);
      }
      else {
LAB_0024a88e:
        if (ublindf != (obj *)0x0) {
LAB_0024a897:
          if (ublindf->oartifact == '\x1d') goto LAB_0024a960;
        }
      }
    }
    else {
LAB_0024a911:
      if (uVar10 == 3) {
        u.uprops[0x1a].intrinsic = 0;
        stop_occupation();
        if (0 < multi) {
          nomul(0,(char *)0x0);
        }
      }
    }
    in_EDI = 3;
    exercise(3,'\0');
  }
  iVar4 = 3;
  if (u.uprops[0x2f].intrinsic != 0) {
    uVar10 = u.uprops[0x2f].intrinsic & 0xffffff;
    iVar5 = (int)((ulong)uVar10 / 3);
    if ((uVar10 < 0xf) && (uVar10 % 3 == 2)) {
      pcVar13 = vomiting_texts_rel + *(int *)(vomiting_texts_rel + (4 - (ulong)uVar10 / 3) * 4);
      iVar4 = 3;
      pline(pcVar13);
      in_EDI = (uint)pcVar13;
    }
    uVar10 = u.uprops[0x1b].intrinsic;
    if (iVar5 == 3) {
LAB_0024a9fc:
      uVar10 = u.uprops[0x1c].intrinsic;
      iVar4 = dice(in_EDI,iVar4);
      make_confused((ulong)(uVar10 + iVar4),'\0');
    }
    else {
      if (iVar5 == 2) {
        iVar4 = dice(in_EDI,iVar4);
        in_EDI = uVar10 + iVar4;
        iVar4 = 0;
        make_stunned((ulong)in_EDI,'\0');
        goto LAB_0024a9fc;
      }
      if (iVar5 == 0) {
        vomit();
        morehungry(0x14);
      }
    }
    exercise(4,'\0');
  }
  if (u.uprops[0x22].intrinsic != 0) {
    uVar10 = u.uprops[0x22].intrinsic & 0xffffff;
    if (uVar10 - 1 < 5) {
      if (((u.uprops[0x31].extrinsic == 0 && u.uprops[0x31].intrinsic == 0) &&
          (((youmonst.data)->mflags1 & 0x400) == 0)) && (uVar6 = mt_random(), uVar6 % 0x32 != 0)) {
        pcVar13 = *(char **)((long)choke_texts + (ulong)((5 - uVar10) * 8));
        pcVar8 = strchr(pcVar13,0x25);
        if (pcVar8 == (char *)0x0) {
          pline(pcVar13);
          goto LAB_0024aacf;
        }
        hcolor("blue");
      }
      else {
        pcVar13 = choke_texts2_rel + *(int *)(choke_texts2_rel + (5 - uVar10) * 4);
        body_part(0xb);
      }
      pline(pcVar13);
    }
LAB_0024aacf:
    exercise(0,'\0');
  }
  if ((u.mtimedone != 0) && (u.mtimedone = u.mtimedone + -1, u.mtimedone == 0)) {
    if (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) {
      rehumanize();
    }
    else {
      u.mtimedone = rnd((youmonst.data)->mlevel * 100 + 1);
    }
  }
  if (u.ucreamed != 0) {
    u.ucreamed = u.ucreamed - 1;
  }
  if ((u.usptime == '\0') ||
     (u.usptime = u.usptime + 0xff, u.uspellprot == '\0' || u.usptime != '\0')) goto LAB_0024abfd;
  u.usptime = u.uspmtime;
  u.uspellprot = u.uspellprot + 0xff;
  find_ac();
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0024aba0;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0024ab9b;
  }
  else {
LAB_0024ab9b:
    if (ublindf == (obj *)0x0) goto LAB_0024abfd;
LAB_0024aba0:
    if (ublindf->oartifact != '\x1d') goto LAB_0024abfd;
  }
  pcVar13 = hcolor("golden");
  pcVar8 = "becomes less dense";
  if (u.uspellprot == '\0') {
    pcVar8 = "disappears";
  }
  Norep("The %s haze around you %s.",pcVar13,pcVar8);
LAB_0024abfd:
  if ((u.ugallop != 0) && (u.ugallop = u.ugallop + -1, u.usteed != (monst *)0x0 && u.ugallop == 0))
  {
    Monnam(u.usteed);
    pline("%s stops galloping.");
  }
  uVar12 = 0x313748;
  lVar11 = 0;
  do {
    if (0x313a6b < uVar12) {
      run_timers();
      return;
    }
    if (((*(uint *)(uVar12 + 8) & 0xffffff) == 0) ||
       (uVar10 = *(uint *)(uVar12 + 8) - 1, *(uint *)(uVar12 + 8) = uVar10, pmVar1 = u.usteed,
       (uVar10 & 0xffffff) != 0)) goto switchD_0024acca_caseD_e;
    switch(lVar11) {
    case 0xc:
      set_mimic_blocking();
      see_monsters();
      newsym((int)u.ux,(int)u.uy);
      goto LAB_0024b069;
    case 0xd:
      newsym((int)u.ux,(int)u.uy);
      if (!(bool)(~((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
                    (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0) ||
                   u.uprops[0xd].blocked != 0) & 1) && u.uprops[0xd].blocked == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0024add8;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0024adcf;
LAB_0024b244:
          pcVar13 = "You can no longer see through yourself.";
          if ((u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) &&
             (pcVar13 = "You can no longer see through yourself.",
             ((youmonst.data)->mflags1 & 0x1000000) == 0)) {
            pcVar13 = "You are no longer invisible.";
          }
          pline(pcVar13);
          stop_occupation();
        }
        else {
LAB_0024adcf:
          if (ublindf != (obj *)0x0) {
LAB_0024add8:
            if (ublindf->oartifact == '\x1d') goto LAB_0024b244;
          }
        }
      }
      break;
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x24:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
      break;
    case 0x12:
      float_down(0x10ffffff,0);
      break;
    case 0x1a:
      if ((u.uprops[0x1a].intrinsic & 0xf8ffffff) == 0 && u.uprops[0x1a].extrinsic == 0) {
        pline("You feel yourself slowing down%s.");
      }
      break;
    case 0x1b:
      u.uprops[0x1b].intrinsic = 1;
      make_stunned(0,'\x01');
      goto LAB_0024b069;
    case 0x1c:
      u.uprops[0x1c].intrinsic = 1;
      make_confused(0,'\x01');
      goto LAB_0024b069;
    case 0x1d:
      pline("You die from your illness.");
      killer_format = 0;
      killer = u.usick_cause;
      uVar10 = name_to_mon(u.usick_cause);
      if (-1 < (int)uVar10) {
        if ((mons[uVar10].mflags2 & 0x80000) == 0) {
          if ((mons[uVar10].geno & 0x1000) == 0) goto LAB_0024afb3;
          killer = the(killer);
          strcpy(u.usick_cause,killer);
        }
        killer_format = 1;
      }
LAB_0024afb3:
      u._971_1_ = u._971_1_ & 0xfc;
      done(2);
      break;
    case 0x1e:
      u.uprops[0x1e].intrinsic = 1;
      make_blinded(0,'\x01');
      goto LAB_0024b069;
    case 0x1f:
      bVar3 = unconscious();
      if ((bVar3 == '\0') &&
         ((((u.uprops[3].intrinsic == 0 && u.uprops[3].extrinsic == 0 ||
            (((u.uprops[3].intrinsic >> 0x1a & 1) != 0 &&
             ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)))) &&
           (((byte)youmonst.mintrinsics & 4) == 0)) && (u.uprops[0x38].extrinsic == 0)))) {
        if (u.uprops[0x1f].extrinsic != 0 || u.uprops[0x1f].intrinsic != 0) {
          pline("You fall asleep.");
          iVar4 = 0x14;
          if (((((u.uprops[3].intrinsic >> 0x1a & 1) != 0) &&
               ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)) &&
              (((byte)youmonst.mintrinsics & 4) == 0)) && (u.uprops[0x38].extrinsic == 0)) {
            iVar4 = 10;
          }
          iVar4 = rnd(iVar4);
          fall_asleep(-iVar4,'\x01');
          iVar5 = rnd(100);
          u.uprops[0x1f].intrinsic = u.uprops[0x1f].intrinsic + iVar5 + iVar4;
        }
      }
      else {
        iVar4 = rnd(100);
        u.uprops[0x1f].intrinsic = u.uprops[0x1f].intrinsic + iVar4;
      }
      break;
    case 0x20:
      heal_legs();
      goto LAB_0024b069;
    case 0x21:
      if (killer == (char *)0x0 && delayed_killer != (char *)0x0) {
        killer = delayed_killer;
        delayed_killer = (char *)0x0;
      }
      else if (killer == (char *)0x0) {
        killer_format = 2;
        killer = "killed by petrification";
      }
      iVar4 = 8;
      goto LAB_0024b138;
    case 0x22:
      killer_format = 1;
      killer = "suffocation";
      if ((u._1052_1_ & 0x20) == 0) {
        killer = "strangulation";
      }
      iVar4 = 0;
LAB_0024b138:
      done(iVar4);
      break;
    case 0x23:
      u.uprops[0x23].intrinsic = 1;
      make_hallucinated(0,'\x01',0);
LAB_0024b069:
      stop_occupation();
      break;
    case 0x25:
      if ((((u.umoved == '\0') || (u.uprops[0x12].intrinsic != 0)) ||
          (u.uprops[0x12].extrinsic != 0)) || ((youmonst.data)->mlet == '\x05')) goto LAB_0024b5f2;
      poVar7 = level->objects[u.ux][u.uy];
      if (((poVar7 != (obj *)0x0 && u.usteed == (monst *)0x0) && ((u._1052_1_ & 2) == 0)) &&
         (bVar3 = is_pool(level,(int)u.ux,(int)u.uy), bVar3 != '\0')) {
        poVar7 = (obj *)0x0;
      }
      if (poVar7 != (obj *)0x0 && pmVar1 == (monst *)0x0) {
        pcVar13 = "it";
        if (((poVar7->quan != 1) && (pcVar13 = "them", u.uprops[0x23].intrinsic != 0)) &&
           ((pcVar13 = "them", u.uprops[0x24].extrinsic == 0 &&
            (pcVar13 = "they", u.umonnum != u.umonster)))) {
          bVar3 = dmgtype(youmonst.data,0x24);
          pcVar13 = "them";
          if (bVar3 == '\0') {
            pcVar13 = "they";
          }
        }
        if ((poVar7->v).v_nexthere != (obj *)0x0) {
          if ((poVar7->field_0x4a & 0x20) == 0) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
                if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0024b40e;
                goto LAB_0024aeea;
              }
LAB_0024aeef:
              if (ublindf->oartifact == '\x1d') goto LAB_0024b40e;
            }
            else {
LAB_0024aeea:
              if (ublindf != (obj *)0x0) goto LAB_0024aeef;
            }
            poVar7 = sobj_at(0x213,level,(int)u.ux,(int)u.uy);
            if (poVar7 == (obj *)0x0) {
              poVar7 = (obj *)0x0;
              pcVar13 = "something";
            }
            else {
              pcVar13 = "some rocks";
              if (poVar7->quan == 1) {
                pcVar13 = "a rock";
              }
            }
          }
          else {
LAB_0024b40e:
            pcVar13 = doname(poVar7);
          }
        }
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
          pcVar8 = "You trip over %s.";
          goto LAB_0024b463;
        }
        strcpy(local_138,pcVar13);
        local_138[0] = highc(local_138[0]);
        pcVar13 = "s";
        if ((poVar7 != (obj *)0x0) && (pcVar13 = "", poVar7->quan == 1)) {
          pcVar13 = "s";
        }
        pcVar9 = body_part(5);
        line = "Egads!  %s bite%s your %s!";
        pcVar8 = local_138;
LAB_0024b4c3:
        pline(line,pcVar8,pcVar13,pcVar9);
        goto LAB_0024b59f;
      }
      uVar10 = mt_random();
      if ((uVar10 % 3 != 0) && (bVar3 = is_ice(level,(int)u.ux,(int)u.uy), bVar3 != '\0')) {
        pcVar8 = "You";
        if (u.usteed != (monst *)0x0) {
          pcVar13 = x_monnam(u.usteed,(uint)((u.usteed)->mnamelth == '\0'),(char *)0x0,8,'\0');
          pcVar8 = upstart(pcVar13);
        }
        uVar10 = mt_random();
        pcVar13 = "rings slip";
        if ((uVar10 & 1) == 0) {
          pcVar13 = "green slide";
        }
        pcVar13 = pcVar13 + 6;
        pcVar9 = "s";
        if (pmVar1 == (monst *)0x0) {
          pcVar9 = "";
        }
        line = "%s %s%s on the ice.";
        goto LAB_0024b4c3;
      }
      uVar10 = mt_random();
      if (pmVar1 != (monst *)0x0) {
        switch(uVar10 & 3) {
        case 0:
          pcVar13 = "You slide to one side of the saddle.";
          break;
        case 1:
          pcVar13 = body_part(5);
          pcVar13 = makeplural(pcVar13);
          pline("Your %s slip out of the stirrups.",pcVar13);
          goto LAB_0024b509;
        case 2:
          pcVar13 = "You let go of the reins.";
          break;
        case 3:
          pcVar13 = "You bang into the saddle-horn.";
        }
        pline(pcVar13);
LAB_0024b509:
        dismount_steed(1);
        goto LAB_0024b59f;
      }
      switch(uVar10 & 3) {
      case 0:
        pcVar13 = "You stumble.";
        break;
      case 1:
        if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_0024b678:
          pcVar13 = body_part(5);
          pcVar13 = makeplural(pcVar13);
        }
        else {
          pcVar13 = "elbow";
          if (u.umonnum != u.umonster) {
            bVar3 = dmgtype(youmonst.data,0x24);
            pcVar13 = "elbow";
            if (bVar3 != '\0') goto LAB_0024b678;
          }
        }
        pcVar8 = "You trip over your own %s.";
        goto LAB_0024b463;
      case 2:
        pcVar13 = "and nearly fall";
        if (((u.uprops[0x23].intrinsic != 0) &&
            (pcVar13 = "and nearly fall", u.uprops[0x24].extrinsic == 0)) &&
           (pcVar13 = "on a banana peel", u.umonnum != u.umonster)) {
          bVar3 = dmgtype(youmonst.data,0x24);
          pcVar13 = "and nearly fall";
          if (bVar3 == '\0') {
            pcVar13 = "on a banana peel";
          }
        }
        pcVar8 = "You slip %s.";
LAB_0024b463:
        pline(pcVar8,pcVar13);
        goto LAB_0024b59f;
      case 3:
        pcVar13 = "You flounder.";
      }
      pline(pcVar13);
LAB_0024b59f:
      nomul(-2,"fumbling");
      nomovemsg = "";
      iVar4 = inv_weight();
      if (-500 < iVar4) {
        pline("You make a lot of noise!");
        wake_nearby();
      }
LAB_0024b5f2:
      u.uprops[0x25].intrinsic = u.uprops[0x25].intrinsic & 0xfbffffff;
      if (u.uprops[0x25].intrinsic != 0 || u.uprops[0x25].extrinsic != 0) {
        iVar4 = rnd(0x14);
        u.uprops[0x25].intrinsic = u.uprops[0x25].intrinsic + iVar4;
      }
      break;
    case 0x2f:
      make_vomiting(0,'\x01');
      break;
    default:
      if (lVar11 == 0x3a) {
        if (killer == (char *)0x0 && delayed_killer != (char *)0x0) {
          killer = delayed_killer;
          delayed_killer = (char *)0x0;
        }
        else if (killer == (char *)0x0) {
          killer_format = 2;
          killer = "turned into green slime";
        }
        iVar4 = 9;
        goto LAB_0024b138;
      }
      if (lVar11 == 0x42) {
        see_monsters();
      }
    }
switchD_0024acca_caseD_e:
    uVar12 = uVar12 + 0xc;
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

void nh_timeout(void)
{
	struct prop *upp;
	int sleeptime;
	int m_idx;
	int baseluck = (flags.moonphase == FULL_MOON) ? 1 : 0;

	if (flags.friday13) baseluck -= 1;

	if (u.uluck != baseluck &&
		moves % (u.uhave.amulet || u.ugangr ? 300 : 600) == 0) {
	/* Cursed luckstones stop bad luck from timing out; blessed luckstones
	 * stop good luck from timing out; normal luckstones stop both;
	 * neither is stopped if you don't have a luckstone.
	 * Luck is based at 0 usually, +1 if a full moon and -1 on Friday 13th
	 */
	    int time_luck = stone_luck(FALSE);
	    boolean nostone = !carrying(LUCKSTONE) && !stone_luck(TRUE);

	    if (u.uluck > baseluck && (nostone || time_luck < 0))
		u.uluck--;
	    else if (u.uluck < baseluck && (nostone || time_luck > 0))
		u.uluck++;
	}
	if (Phasing) phasing_dialogue();
	if (u.uinvulnerable) return; /* things past this point could kill you */
	if (Stoned) stoned_dialogue();
	if (Slimed) slime_dialogue();
	if (Vomiting) vomiting_dialogue();
	if (Strangled) choke_dialogue();
	if (u.mtimedone && !--u.mtimedone) {
		if (Unchanging)
			u.mtimedone = rnd(100*youmonst.data->mlevel + 1);
		else
			rehumanize();
	}
	if (u.ucreamed) u.ucreamed--;

	/* Dissipate spell-based protection. */
	if (u.usptime) {
	    if (--u.usptime == 0 && u.uspellprot) {
		u.usptime = u.uspmtime;
		u.uspellprot--;
		find_ac();
		if (!Blind)
		    Norep("The %s haze around you %s.", hcolor("golden"),
			  u.uspellprot ? "becomes less dense" : "disappears");
	    }
	}

	if (u.ugallop) {
	    if (--u.ugallop == 0L && u.usteed)
	    	pline("%s stops galloping.", Monnam(u.usteed));
	}

	for (upp = u.uprops; upp < u.uprops+SIZE(u.uprops); upp++)
	    if ((upp->intrinsic & TIMEOUT) && !(--upp->intrinsic & TIMEOUT)) {
		switch(upp - u.uprops){
		case STONED:
			if (delayed_killer && !killer) {
				killer = delayed_killer;
				delayed_killer = 0;
			}
			if (!killer) {
				/* leaving killer_format would make it
				   "petrified by petrification" */
				killer_format = NO_KILLER_PREFIX;
				killer = "killed by petrification";
			}
			done(STONING);
			break;
		case SLIMED:
			if (delayed_killer && !killer) {
				killer = delayed_killer;
				delayed_killer = 0;
			}
			if (!killer) {
				killer_format = NO_KILLER_PREFIX;
				killer = "turned into green slime";
			}
			done(TURNED_SLIME);
			break;
		case VOMITING:
			make_vomiting(0L, TRUE);
			break;
		case SICK:
			pline("You die from your illness.");
			killer_format = KILLED_BY_AN;
			killer = u.usick_cause;
			if ((m_idx = name_to_mon(killer)) >= LOW_PM) {
			    if (type_is_pname(&mons[m_idx])) {
				killer_format = KILLED_BY;
			    } else if (mons[m_idx].geno & G_UNIQ) {
				killer = the(killer);
				strcpy(u.usick_cause, killer);
				killer_format = KILLED_BY;
			    }
			}
			u.usick_type = 0;
			done(POISONING);
			break;
		case FAST:
			if (!Very_fast)
				pline("You feel yourself slowing down%s.",
							Fast ? " a bit" : "");
			break;
		case CONFUSION:
			HConfusion = 1; /* So make_confused works properly */
			make_confused(0L, TRUE);
			stop_occupation();
			break;
		case STUNNED:
			HStun = 1;
			make_stunned(0L, TRUE);
			stop_occupation();
			break;
		case BLINDED:
			Blinded = 1;
			make_blinded(0L, TRUE);
			stop_occupation();
			break;
		case INVIS:
			newsym(u.ux,u.uy);
			if (!Invis && !BInvis && !Blind) {
			    pline(!See_invisible ?
				    "You are no longer invisible." :
				    "You can no longer see through yourself.");
			    stop_occupation();
			}
			break;
		case SEE_INVIS:
			set_mimic_blocking(); /* do special mimic handling */
			see_monsters();		/* make invis mons appear */
			newsym(u.ux,u.uy);	/* make self appear */
			stop_occupation();
			break;
		case WOUNDED_LEGS:
			heal_legs();
			stop_occupation();
			break;
		case HALLUC:
			HHallucination = 1;
			make_hallucinated(0L, TRUE, 0L);
			stop_occupation();
			break;
		case SLEEPING:
			if (unconscious() || FSleep_resistance) {
				HSleeping += rnd(100);
			} else if (Sleeping) {
				pline("You fall asleep.");
				sleeptime = rnd(PSleep_resistance ? 10 : 20);
				fall_asleep(-sleeptime, TRUE);
				HSleeping += sleeptime + rnd(100);
			}
			break;
		case LEVITATION:
			float_down(I_SPECIAL|TIMEOUT, 0L);
			break;
		case STRANGLED:
			killer_format = KILLED_BY;
			killer = (u.uburied) ? "suffocation" : "strangulation";
			done(DIED);
			break;
		case FUMBLING:
			/* call this only when a move took place.  */
			/* otherwise handle fumbling msgs locally. */
			if (u.umoved && !Levitation) {
			    slip_or_trip();
			    nomul(-2, "fumbling");
			    nomovemsg = "";
			    /* The more you are carrying the more likely you
			     * are to make noise when you fumble.  Adjustments
			     * to this number must be thoroughly play tested.
			     */
			    if ((inv_weight() > -500)) {
				pline("You make a lot of noise!");
				wake_nearby();
			    }
			}
			/* from outside means slippery ice; don't reset
			   counter if that's the only fumble reason */
			HFumbling &= ~FROMOUTSIDE;
			if (Fumbling)
			    HFumbling += rnd(20);
			break;
		case DETECT_MONSTERS:
			see_monsters();
			break;
		}
	}

	run_timers();
}